

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  uint32 uVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  int local_24;
  int local_20;
  int i_2;
  int i_1;
  int i;
  int num_local;
  int start_local;
  UnknownFieldSet *this_local;
  
  for (i_2 = 0; i_2 < num; i_2 = i_2 + 1) {
    pvVar2 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](this->fields_,(long)(i_2 + start));
    UnknownField::Delete(pvVar2);
  }
  local_20 = start + num;
  while( true ) {
    sVar3 = std::
            vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ::size(this->fields_);
    if (sVar3 <= (ulong)(long)local_20) break;
    pvVar2 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](this->fields_,(long)local_20);
    pvVar4 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](this->fields_,(long)(local_20 - num));
    uVar1 = pvVar2->type_;
    pvVar4->number_ = pvVar2->number_;
    pvVar4->type_ = uVar1;
    pvVar4->data_ = pvVar2->data_;
    local_20 = local_20 + 1;
  }
  for (local_24 = 0; local_24 < num; local_24 = local_24 + 1) {
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    pop_back(this->fields_);
  }
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    sVar3 = std::
            vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ::size(this->fields_);
    if (sVar3 == 0) {
      this_00 = this->fields_;
      if (this_00 !=
          (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *
          )0x0) {
        std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ::~vector(this_00);
        operator_delete(this_00,0x18);
      }
      this->fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (*fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_->size(); ++i) {
    (*fields_)[i - num] = (*fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_->pop_back();
  }
  if (fields_ && fields_->size() == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}